

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O0

MortonCode64 __thiscall Resorting::MortonCode64::InvertDimension<0>(MortonCode64 *this)

{
  ulong uVar1;
  uint64_t sum;
  uint64_t c;
  uint64_t mask;
  MortonCode64 *this_local;
  
  uVar1 = this->data ^ xMask;
  MortonCode64((MortonCode64 *)&this_local,
               (uVar1 | xMask ^ 0xffffffffffffffffU) + 1 & xMask |
               uVar1 & (xMask ^ 0xffffffffffffffffU));
  return (MortonCode64)(uint64_t)this_local;
}

Assistant:

MortonCode64 MortonCode64::InvertDimension() const
{
    static_assert(
        0 <= DIM && DIM < 3, "The dimension must be between 0 and 2.");
    uint64_t mask = xMask << DIM;

    //(2 - complement)
    // invert bits
    uint64_t c = data ^ mask;
    // add 1
    uint64_t sum = (c | ~mask) + 1; // fill the bits that are not in the mask
                                    // with 1 to make sure carry gets carried on
    return MortonCode64((sum & mask) | (c & ~mask));
}